

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O1

void db_destroy_test_full_path(void)

{
  size_t *psVar1;
  long *plVar2;
  long *plVar3;
  void *pvVar4;
  int iVar5;
  fdb_status fVar6;
  time_t tVar7;
  uint8_t *puVar8;
  size_t sVar9;
  size_t sVar10;
  btree *pbVar11;
  fdb_config *fconfig;
  long lVar12;
  uint uVar13;
  char *info;
  char *pcVar14;
  fdb_kvs_handle *pfVar15;
  fdb_kvs_ops_info *unaff_R12;
  code *unaff_R13;
  fdb_doc *pfVar16;
  char *info_00;
  ulong uVar17;
  btree *pbVar18;
  bool bVar19;
  timeval tVar20;
  fdb_file_handle *dbfile;
  timeval __test_begin;
  char cmd [256];
  char path [256];
  int iStack_cdc;
  fdb_doc *pfStack_cd8;
  fdb_file_handle *pfStack_cd0;
  undefined4 uStack_cc8;
  undefined3 uStack_cc4;
  undefined1 uStack_cc1;
  fdb_kvs_handle *pfStack_cc0;
  uint uStack_cb4;
  timeval tStack_cb0;
  timeval tStack_ca0;
  timeval tStack_c90;
  fdb_file_info fStack_c80;
  char acStack_c38 [1032];
  fdb_config *pfStack_830;
  fdb_kvs_ops_info *pfStack_828;
  fdb_doc *pfStack_820;
  btree *pbStack_818;
  btree *pbStack_810;
  fdb_config *pfStack_808;
  fdb_kvs_handle *pfStack_7f0;
  fdb_doc *pfStack_7e8;
  fdb_iterator *pfStack_7e0;
  undefined8 uStack_7d8;
  fdb_kvs_handle *apfStack_7d0 [4];
  undefined1 auStack_7b0 [64];
  undefined1 auStack_770 [32];
  undefined1 auStack_750 [56];
  undefined1 auStack_718 [40];
  btree bStack_6f0;
  char acStack_6a0 [256];
  undefined1 auStack_5a0 [16];
  undefined1 auStack_590 [16];
  undefined1 auStack_580 [16];
  undefined1 auStack_570 [16];
  undefined1 auStack_560 [16];
  fdb_doc afStack_550 [3];
  fdb_config fStack_450;
  char *pcStack_358;
  undefined1 local_328 [24];
  fdb_config local_310;
  char local_218 [256];
  char local_118 [256];
  
  pbVar18 = (btree *)local_328;
  pbVar11 = (btree *)local_328;
  gettimeofday((timeval *)(local_328 + 8),(__timezone_ptr_t)0x0);
  memleak_start();
  tVar7 = time((time_t *)0x0);
  srand((uint)tVar7);
  iVar5 = rand();
  sprintf(local_118,"/tmp/fdb_destroy_test_%d",(ulong)(uint)(iVar5 % 10000));
  sprintf(local_218,"rm -rf %s*",local_118);
  system(local_218);
  fdb_get_default_config();
  local_310.compaction_mode = '\x01';
  fdb_open((fdb_file_handle **)local_328,local_118,&local_310);
  fdb_close((fdb_file_handle *)local_328._0_8_);
  pcVar14 = local_118;
  fVar6 = fdb_destroy(local_118,&local_310);
  if (fVar6 == FDB_RESULT_SUCCESS) {
    fdb_shutdown();
    memleak_end();
    pcVar14 = "%s PASSED\n";
    if (db_destroy_test_full_path()::__test_pass != '\0') {
      pcVar14 = "%s FAILED\n";
    }
    fprintf(_stderr,pcVar14,"Database destroy (full path) test");
    return;
  }
  db_destroy_test_full_path();
  info = (char *)((ulong)pcVar14 & 0xffffffff);
  info_00 = (char *)0x0;
  pfStack_808 = (fdb_config *)0x112a5f;
  pcStack_358 = local_118;
  gettimeofday((timeval *)(auStack_718 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_808 = (fdb_config *)0x112a64;
  memleak_start();
  pfStack_7e8 = (fdb_doc *)auStack_5a0;
  auStack_7b0._0_16_ = (undefined1  [16])0x0;
  auStack_7b0._16_8_ = (void *)0x0;
  auStack_7b0._24_8_ = (kvs_info *)0x0;
  auStack_7b0._32_8_ = (fdb_config *)0x0;
  auStack_7b0._40_8_ = (fdb_file_handle *)0x0;
  auStack_7b0._48_8_ = (hbtrie *)0x0;
  auStack_5a0 = (undefined1  [16])0x0;
  auStack_590 = (undefined1  [16])0x0;
  auStack_570 = (undefined1  [16])0x0;
  auStack_580._8_8_ = 0;
  auStack_580._0_8_ = acStack_6a0;
  auStack_560._8_8_ = 0;
  auStack_560._0_8_ = afStack_550;
  pfStack_808 = (fdb_config *)0x112acb;
  system("rm -rf  dummy* > errorlog.txt");
  fconfig = &fStack_450;
  pfStack_808 = (fdb_config *)0x112adb;
  fdb_get_default_config();
  pfStack_808 = (fdb_config *)0x112ae8;
  fdb_get_default_kvs_config();
  fStack_450.buffercache_size = 0;
  fStack_450.seqtree_opt = '\x01';
  fStack_450.wal_threshold = 0x400;
  fStack_450.flags = 1;
  fStack_450.compaction_threshold = '\0';
  fStack_450.multi_kv_instances = SUB81(info,0);
  pfStack_808 = (fdb_config *)0x112b1b;
  fdb_open((fdb_file_handle **)&pfStack_7f0,"./dummy1",fconfig);
  uStack_7d8._4_4_ = (int)pcVar14;
  if (uStack_7d8._4_4_ != 0) {
    fconfig = (fdb_config *)0x3;
    info_00 = (char *)0x18;
    pbVar18 = (btree *)auStack_750;
    unaff_R12 = (fdb_kvs_ops_info *)auStack_718;
    unaff_R13 = logCallbackFunc;
    info = "operational_stats_test";
    do {
      pfStack_808 = (fdb_config *)0x112b63;
      sprintf((char *)pbVar18,"kv%d",(ulong)fconfig & 0xffffffff);
      pfStack_808 = (fdb_config *)0x112b7b;
      fVar6 = fdb_kvs_open((fdb_file_handle *)pfStack_7f0,
                           (fdb_kvs_handle **)((long)apfStack_7d0 + (long)info_00),(char *)pbVar18,
                           (fdb_kvs_config *)unaff_R12);
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113110;
      pfStack_808 = (fdb_config *)0x112b93;
      fVar6 = fdb_set_log_callback
                        (apfStack_7d0[(long)fconfig],logCallbackFunc,"operational_stats_test");
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011310b;
      info_00 = (char *)&((btree *)((long)info_00 + -0x38))->aux;
      bVar19 = fconfig != (fdb_config *)0x0;
      fconfig = (fdb_config *)&fconfig[-1].field_0xf7;
    } while (bVar19);
    auStack_7b0._56_8_ = (btree *)0x3;
LAB_00112bed:
    puVar8 = &((btree *)auStack_7b0._56_8_)->vsize;
    info = auStack_750;
    fconfig = (fdb_config *)auStack_7b0;
    info_00 = (char *)0x0;
    do {
      pfStack_808 = (fdb_config *)0x112c29;
      sprintf(acStack_6a0,"key%d",(ulong)info_00 & 0xffffffff);
      unaff_R13 = (code *)afStack_550;
      pfStack_808 = (fdb_config *)0x112c45;
      sprintf((char *)unaff_R13,"body%d",(ulong)info_00 & 0xffffffff);
      unaff_R12 = (fdb_kvs_ops_info *)(&bStack_6f0.ksize + (long)info_00 * 8);
      pfStack_808 = (fdb_config *)0x112c58;
      sVar9 = strlen(acStack_6a0);
      pfStack_808 = (fdb_config *)0x112c64;
      sVar10 = strlen((char *)unaff_R13);
      pfStack_808 = (fdb_config *)0x112c86;
      fdb_doc_create((fdb_doc **)unaff_R12,acStack_6a0,sVar9 + 1,(void *)0x0,0,unaff_R13,sVar10 + 1)
      ;
      info_00 = (char *)((long)info_00 + 1);
      pbVar18 = (btree *)puVar8;
      do {
        pfStack_808 = (fdb_config *)0x112c9c;
        fVar6 = fdb_set((fdb_kvs_handle *)(&uStack_7d8)[(long)pbVar18],
                        (fdb_doc *)unaff_R12->num_sets);
        if (fVar6 != FDB_RESULT_SUCCESS) {
          pfStack_808 = (fdb_config *)0x11308a;
          operational_stats_test();
LAB_0011308a:
          pfStack_808 = (fdb_config *)0x11308f;
          operational_stats_test();
LAB_0011308f:
          pfStack_808 = (fdb_config *)0x1130a1;
          operational_stats_test();
          pfVar16 = (fdb_doc *)unaff_R13;
          goto LAB_001130a1;
        }
        pfStack_808 = (fdb_config *)0x112cb1;
        fVar6 = fdb_get_kvs_ops_info
                          ((fdb_kvs_handle *)(&uStack_7d8)[(long)pbVar18],(fdb_kvs_ops_info *)info);
        if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011308a;
        auStack_7b0._0_8_ = info_00;
        pfStack_808 = (fdb_config *)0x112cce;
        iVar5 = bcmp(info,fconfig,0x38);
        if (iVar5 != 0) goto LAB_0011308f;
        pbVar11 = (btree *)((long)&pbVar18[-1].aux + 7);
        bVar19 = 0 < (long)pbVar18;
        pbVar18 = pbVar11;
      } while (pbVar11 != (btree *)0x0 && bVar19);
    } while (info_00 != (char *)0xa);
    info_00 = auStack_750;
    pbVar11 = (btree *)auStack_7b0._56_8_;
    do {
      pfStack_808 = (fdb_config *)0x112d1a;
      fdb_iterator_init(apfStack_7d0[(long)pbVar11],&pfStack_7e0,(void *)0x0,0,(void *)0x0,0,0);
      pbVar18 = &bStack_6f0;
      pfVar16 = (fdb_doc *)unaff_R13;
      do {
        pfStack_808 = (fdb_config *)0x112d31;
        fVar6 = fdb_iterator_get(pfStack_7e0,&pfStack_7e8);
        unaff_R13 = (code *)pfStack_7e8;
        if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001130a1;
        fconfig = (fdb_config *)pfStack_7e8->key;
        unaff_R12 = *(fdb_kvs_ops_info **)pbVar18;
        info = (char *)unaff_R12->num_gets;
        pfStack_808 = (fdb_config *)0x112d59;
        iVar5 = bcmp(fconfig,info,pfStack_7e8->keylen);
        if (iVar5 != 0) goto LAB_001130ab;
        fconfig = (fdb_config *)((fdb_doc *)unaff_R13)->body;
        info = (char *)unaff_R12[1].num_dels;
        pfStack_808 = (fdb_config *)0x112d79;
        iVar5 = bcmp(fconfig,info,((fdb_doc *)unaff_R13)->bodylen);
        if (iVar5 != 0) goto LAB_001130c8;
        pfStack_808 = (fdb_config *)0x112d93;
        fVar6 = fdb_get_kvs_ops_info(apfStack_7d0[(long)pbVar11],(fdb_kvs_ops_info *)info_00);
        if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001130a6;
        auStack_7b0._40_8_ = (long)(fdb_kvs_handle **)auStack_7b0._40_8_ + 1;
        auStack_7b0._48_8_ = auStack_7b0._48_8_ + 1;
        pfStack_808 = (fdb_config *)0x112dc1;
        iVar5 = bcmp(info_00,auStack_7b0,0x38);
        if (iVar5 != 0) goto LAB_001130b6;
        pfStack_808 = (fdb_config *)0x112dd3;
        fVar6 = fdb_iterator_next(pfStack_7e0);
        pbVar18 = (btree *)&pbVar18->root_bid;
        pfVar16 = (fdb_doc *)unaff_R13;
      } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
      auStack_7b0._48_8_ = auStack_7b0._48_8_ + 1;
      pfStack_808 = (fdb_config *)0x112df2;
      fdb_iterator_close(pfStack_7e0);
      pfStack_808 = (fdb_config *)0x112e01;
      fdb_commit((fdb_file_handle *)pfStack_7f0,'\x01');
      auStack_7b0._16_8_ = (void *)(auStack_7b0._16_8_ + 1);
      pfStack_808 = (fdb_config *)0x112e18;
      fVar6 = fdb_get_kvs_ops_info(apfStack_7d0[(long)pbVar11],(fdb_kvs_ops_info *)info_00);
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113101;
      pfStack_808 = (fdb_config *)0x112e32;
      iVar5 = bcmp(info_00,auStack_7b0,0x38);
      if (iVar5 != 0) goto LAB_001130ef;
      if (pbVar11 != (btree *)0x0) {
        auStack_7b0._40_8_ = (fdb_file_handle *)0x0;
        auStack_7b0._48_8_ = (hbtrie *)0x0;
      }
      bVar19 = 0 < (long)pbVar11;
      pbVar11 = (btree *)((long)&pbVar11[-1].aux + 7);
    } while (bVar19);
    auStack_7b0._24_8_ = auStack_7b0._24_8_ + 1;
    pfStack_808 = (fdb_config *)0x112e74;
    fdb_compact((fdb_file_handle *)pfStack_7f0,"./dummy2");
    pfStack_808 = (fdb_config *)0x112e86;
    fVar6 = fdb_get_kvs_ops_info(apfStack_7d0[0],(fdb_kvs_ops_info *)auStack_750);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113115;
    pfStack_808 = (fdb_config *)0x112ea5;
    iVar5 = bcmp(auStack_750,auStack_7b0,0x38);
    info_00 = (char *)auStack_7b0._56_8_;
    if (iVar5 == 0) {
      pbVar18 = (btree *)(auStack_7b0._56_8_ + 1);
      unaff_R12 = (fdb_kvs_ops_info *)auStack_750;
      unaff_R13 = (code *)auStack_7b0;
      fconfig = (fdb_config *)0x0;
      do {
        pfStack_808 = (fdb_config *)0x112ee2;
        sprintf(acStack_6a0,"key%d",(ulong)fconfig & 0xffffffff);
        info = (char *)((long)&fconfig->chunksize + 1);
        info_00 = (char *)pbVar18;
        do {
          if (((ulong)fconfig & 1) == 0) {
            if (((ulong)fconfig & 2) == 0) {
              pfStack_808 = (fdb_config *)0x112f01;
              fVar6 = fdb_get_metaonly((fdb_kvs_handle *)(&uStack_7d8)[(long)info_00],pfStack_7e8);
            }
            else {
              pfStack_7e8->seqnum = (fdb_seqnum_t)info;
              pfStack_808 = (fdb_config *)0x112f27;
              fVar6 = fdb_get_byseq((fdb_kvs_handle *)(&uStack_7d8)[(long)info_00],pfStack_7e8);
            }
          }
          else {
            pfStack_808 = (fdb_config *)0x112f12;
            fVar6 = fdb_get((fdb_kvs_handle *)(&uStack_7d8)[(long)info_00],pfStack_7e8);
          }
          if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001130d3;
          pfStack_808 = (fdb_config *)0x112f3c;
          fVar6 = fdb_get_kvs_ops_info((fdb_kvs_handle *)(&uStack_7d8)[(long)info_00],unaff_R12);
          if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001130d8;
          pfStack_808 = (fdb_config *)0x112f59;
          auStack_7b0._32_8_ = info;
          iVar5 = bcmp(unaff_R12,unaff_R13,0x38);
          if (iVar5 != 0) goto LAB_001130dd;
          pbVar11 = (btree *)((long)&((btree *)((long)info_00 + -0x38))->aux + 7);
          bVar19 = 0 < (long)info_00;
          info_00 = (char *)pbVar11;
        } while (pbVar11 != (btree *)0x0 && bVar19);
        fconfig = (fdb_config *)info;
      } while ((fdb_config *)info != (fdb_config *)0xa);
      fconfig = (fdb_config *)auStack_770;
      pbVar18 = (btree *)&stderr;
      info_00 = "%d:\t%u\t%u\t%u\t%lu\n";
      info = (char *)0x0;
      while( true ) {
        auStack_770._0_16_ = (undefined1  [16])0x0;
        auStack_770._16_8_ = (docio_handle *)0x0;
        pfStack_808 = (fdb_config *)0x112fb5;
        fVar6 = fdb_get_latency_stats
                          ((fdb_file_handle *)pfStack_7f0,(fdb_latency_stat *)fconfig,
                           (fdb_latency_stat_type)info);
        if (fVar6 != FDB_RESULT_SUCCESS) break;
        pfStack_808 = (fdb_config *)0x112fea;
        fprintf(_stderr,"%d:\t%u\t%u\t%u\t%lu\n",info);
        uVar13 = (int)info + 1;
        info = (char *)(ulong)uVar13;
        if (uVar13 == 0x13) {
          pfStack_808 = (fdb_config *)0x112ffb;
          fdb_close((fdb_file_handle *)pfStack_7f0);
          lVar12 = 0;
          do {
            pfStack_808 = (fdb_config *)0x11300a;
            fdb_doc_free(*(fdb_doc **)(&bStack_6f0.ksize + lVar12 * 8));
            lVar12 = lVar12 + 1;
          } while (lVar12 != 10);
          pfStack_808 = (fdb_config *)0x113018;
          fdb_shutdown();
          pfStack_808 = (fdb_config *)0x11301d;
          memleak_end();
          pcVar14 = "single kv instance";
          if (uStack_7d8._4_1_ != '\0') {
            pcVar14 = "multiple kv instances";
          }
          pfStack_808 = (fdb_config *)0x11304d;
          sprintf((char *)afStack_550,"Operational stats test %s",pcVar14);
          pcVar14 = "%s PASSED\n";
          if (operational_stats_test(bool)::__test_pass != '\0') {
            pcVar14 = "%s FAILED\n";
          }
          pfStack_808 = (fdb_config *)0x113073;
          fprintf(_stderr,pcVar14,afStack_550);
          return;
        }
      }
      goto LAB_00113106;
    }
    goto LAB_0011311a;
  }
  pfStack_808 = (fdb_config *)0x112bc3;
  pfVar15 = pfStack_7f0;
  fVar6 = fdb_kvs_open_default
                    ((fdb_file_handle *)pfStack_7f0,apfStack_7d0,(fdb_kvs_config *)auStack_718);
  if (fVar6 == FDB_RESULT_SUCCESS) {
    pfStack_808 = (fdb_config *)0x112be3;
    pfVar15 = apfStack_7d0[0];
    fVar6 = fdb_set_log_callback(apfStack_7d0[0],logCallbackFunc,"operational_stats_test");
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00113131;
    auStack_7b0._56_8_ = (btree *)0x0;
    goto LAB_00112bed;
  }
  goto LAB_0011312c;
LAB_001130a1:
  unaff_R13 = (code *)pfVar16;
  pfStack_808 = (fdb_config *)0x1130a6;
  operational_stats_test();
LAB_001130a6:
  pfStack_808 = (fdb_config *)0x1130ab;
  operational_stats_test();
LAB_001130ab:
  pfStack_808 = (fdb_config *)0x1130b6;
  operational_stats_test();
LAB_001130b6:
  pfStack_808 = (fdb_config *)0x1130c8;
  operational_stats_test();
LAB_001130c8:
  pfStack_808 = (fdb_config *)0x1130d3;
  operational_stats_test();
LAB_001130d3:
  pfStack_808 = (fdb_config *)0x1130d8;
  operational_stats_test();
LAB_001130d8:
  pfStack_808 = (fdb_config *)0x1130dd;
  operational_stats_test();
LAB_001130dd:
  pfStack_808 = (fdb_config *)0x1130ef;
  operational_stats_test();
LAB_001130ef:
  pfStack_808 = (fdb_config *)0x113101;
  operational_stats_test();
LAB_00113101:
  pfStack_808 = (fdb_config *)0x113106;
  operational_stats_test();
LAB_00113106:
  pfStack_808 = (fdb_config *)0x11310b;
  operational_stats_test();
LAB_0011310b:
  pfStack_808 = (fdb_config *)0x113110;
  operational_stats_test();
LAB_00113110:
  pfStack_808 = (fdb_config *)0x113115;
  operational_stats_test();
LAB_00113115:
  pfStack_808 = (fdb_config *)0x11311a;
  operational_stats_test();
LAB_0011311a:
  pfVar15 = (fdb_kvs_handle *)auStack_7b0;
  pfStack_808 = (fdb_config *)0x11312c;
  operational_stats_test();
LAB_0011312c:
  pfStack_808 = (fdb_config *)0x113131;
  operational_stats_test();
  pbVar11 = pbVar18;
LAB_00113131:
  pfStack_808 = (fdb_config *)_worker_thread;
  operational_stats_test();
  pfStack_830 = fconfig;
  pfStack_828 = unaff_R12;
  pfStack_820 = (fdb_doc *)unaff_R13;
  pbStack_818 = (btree *)info_00;
  pbStack_810 = pbVar11;
  pfStack_808 = (fdb_config *)info;
  gettimeofday(&tStack_c90,(__timezone_ptr_t)0x0);
  pfStack_cd8 = (fdb_doc *)0x0;
  sprintf(acStack_c38,"dummy%d",(ulong)*(uint *)&pfVar15->file->filename);
  fdb_open(&pfStack_cd0,acStack_c38,(fdb_config *)pfVar15->btreeblkops);
  fdb_kvs_open_default(pfStack_cd0,&pfStack_cc0,(fdb_kvs_config *)pfVar15->fileops);
  fVar6 = fdb_set_log_callback(pfStack_cc0,logCallbackFunc,"worker_thread");
  if (fVar6 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x6c4);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x6c4,"void *_worker_thread(void *)");
  }
  pthread_spin_lock((pthread_spinlock_t *)pfVar15->dhandle);
  *(int *)(pfVar15->field_6).seqtree = *(int *)(pfVar15->field_6).seqtree + 1;
  pthread_spin_unlock((pthread_spinlock_t *)pfVar15->dhandle);
  while( true ) {
    pthread_spin_lock((pthread_spinlock_t *)pfVar15->dhandle);
    pbVar18 = (pfVar15->field_6).seqtree;
    iVar5._0_1_ = pbVar18->ksize;
    iVar5._1_1_ = pbVar18->vsize;
    iVar5._2_2_ = pbVar18->height;
    if ((list *)(pfVar15->kvs_config).custom_cmp == (list *)(long)iVar5) break;
    pthread_spin_unlock((pthread_spinlock_t *)pfVar15->dhandle);
    sleep(1);
  }
  pthread_spin_unlock((pthread_spinlock_t *)pfVar15->dhandle);
  gettimeofday((timeval *)&tStack_ca0,(__timezone_ptr_t)0x0);
  uStack_cc1 = 0;
  uVar17 = 0;
  iStack_cdc = 0;
  do {
    iVar5 = rand();
    iVar5 = (int)((ulong)(long)iVar5 % (ulong)(pfVar15->kvs_config).custom_cmp_param);
    psVar1 = (size_t *)(&pfVar15->op_stats->num_sets)[iVar5].super___atomic_base<unsigned_long>._M_i
    ;
    fdb_doc_create(&pfStack_cd8,(void *)psVar1[4],*psVar1,(void *)0x0,0,(void *)0x0,0);
    fVar6 = fdb_get(pfStack_cc0,pfStack_cd8);
    if (fVar6 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x6e1);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x6e1,"void *_worker_thread(void *)");
    }
    plVar2 = (long *)pfStack_cd8->body;
    plVar3 = *(long **)((&pfVar15->op_stats->num_sets)[iVar5].super___atomic_base<unsigned_long>.
                        _M_i + 0x40);
    if (*plVar2 != *plVar3) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",plVar3,plVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x6e2);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x6e2,"void *_worker_thread(void *)");
    }
    if (pfVar15->kvs != (kvs_info *)0x0) {
      uStack_cc8 = (undefined4)plVar2[1];
      uStack_cc4 = (undefined3)((uint)*(undefined4 *)((long)plVar2 + 0xb) >> 8);
      iVar5 = atoi((char *)&uStack_cc8);
      sprintf((char *)&uStack_cc8,"%0 7d",(ulong)(iVar5 + 1));
      pvVar4 = pfStack_cd8->body;
      *(uint *)((long)pvVar4 + 0xb) = CONCAT31(uStack_cc4,uStack_cc8._3_1_);
      *(undefined4 *)((long)pvVar4 + 8) = uStack_cc8;
      fVar6 = fdb_set(pfStack_cc0,pfStack_cd8);
      if (fVar6 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x6f0);
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x6f0,"void *_worker_thread(void *)");
      }
      if ((pfVar15->trie != (hbtrie *)0x0) && (uVar17 % (ulong)pfVar15->trie == 0)) {
        fdb_commit(pfStack_cd0,'\0');
        iStack_cdc = iStack_cdc + 1;
        fdb_get_file_info(pfStack_cd0,&fStack_c80);
        if ((pfVar15->staletree == (btree *)(long)iStack_cdc) &&
           (((pfVar15->staletree != (btree *)0x0 && (fStack_c80.new_filename == (char *)0x0)) &&
            (*(int *)&pfVar15->kvs_config == 0)))) {
          pthread_spin_lock((pthread_spinlock_t *)pfVar15->dhandle);
          uStack_cb4 = *(int *)&pfVar15->file->filename + 1;
          *(uint *)&pfVar15->file->filename = uStack_cb4;
          pthread_spin_unlock((pthread_spinlock_t *)pfVar15->dhandle);
          iStack_cdc = 0;
          sprintf(acStack_c38,"dummy%d",(ulong)uStack_cb4);
          fVar6 = fdb_compact(pfStack_cd0,acStack_c38);
          if (fVar6 != FDB_RESULT_SUCCESS) {
            pthread_spin_lock((pthread_spinlock_t *)pfVar15->dhandle);
            *(int *)&pfVar15->file->filename = *(int *)&pfVar15->file->filename + -1;
            pthread_spin_unlock((pthread_spinlock_t *)pfVar15->dhandle);
          }
        }
      }
    }
    fdb_doc_free(pfStack_cd8);
    pfStack_cd8 = (fdb_doc *)0x0;
    uVar17 = uVar17 + 1;
    gettimeofday((timeval *)&tStack_cb0,(__timezone_ptr_t)0x0);
    tVar20 = _utime_gap(tStack_ca0,tStack_cb0);
  } while ((fdb_file_handle *)tVar20.tv_sec < pfVar15->fhandle);
  pcVar14 = "writer";
  if (pfVar15->kvs == (kvs_info *)0x0) {
    pcVar14 = "reader";
  }
  printf("Thread #%d (%s) %d ops / %d seconds\n",(ulong)*(uint *)&pfVar15->kvs_config,pcVar14,
         uVar17 & 0xffffffff);
  pfVar15->bhandle = (btreeblk_handle *)(uVar17 & 0xffffffff);
  fdb_commit(pfStack_cd0,'\x01');
  fdb_kvs_close(pfStack_cc0);
  fdb_close(pfStack_cd0);
  pthread_exit((void *)0x0);
}

Assistant:

void db_destroy_test_full_path()
{
    TEST_INIT();

    memleak_start();
    randomize();

    int r;
    fdb_file_handle *dbfile;
    fdb_config config;
    fdb_status s;
    char path[256];
    char cmd[256];

    sprintf(path, "/tmp/fdb_destroy_test_%d", random(10000));

    sprintf(cmd, "rm -rf %s*", path);
    r = system(cmd); (void)r;

    config = fdb_get_default_config();
    config.compaction_mode = FDB_COMPACTION_AUTO;

    fdb_open(&dbfile, path, &config);
    fdb_close(dbfile);

    s = fdb_destroy(path, &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    fdb_shutdown();

    memleak_end();

    TEST_RESULT("Database destroy (full path) test");
}